

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

void ossl_keylog_callback(SSL *ssl,char *line)

{
  size_t __n;
  char *__dest;
  FILE *__stream;
  char stackbuf [256];
  char acStack_128 [256];
  
  __stream = (FILE *)keylog_file_fp;
  __dest = acStack_128;
  if (((line != (char *)0x0 && keylog_file_fp != (FILE *)0x0) && (*line != '\0')) &&
     ((__n = strlen(line), __n < 0xff ||
      (__dest = (char *)(*Curl_cmalloc)(__n + 2), __stream = (FILE *)keylog_file_fp,
      __dest != (char *)0x0)))) {
    strncpy(__dest,line,__n);
    (__dest + __n)[0] = '\n';
    (__dest + __n)[1] = '\0';
    fputs(__dest,__stream);
    if (__dest != acStack_128) {
      (*Curl_cfree)(__dest);
    }
  }
  return;
}

Assistant:

static void ossl_keylog_callback(const SSL *ssl, const char *line)
{
  (void)ssl;

  /* Using fputs here instead of fprintf since libcurl's fprintf replacement
     may not be thread-safe. */
  if(keylog_file_fp && line && *line) {
    char stackbuf[256];
    char *buf;
    size_t linelen = strlen(line);

    if(linelen <= sizeof(stackbuf) - 2)
      buf = stackbuf;
    else {
      buf = malloc(linelen + 2);
      if(!buf)
        return;
    }
    strncpy(buf, line, linelen);
    buf[linelen] = '\n';
    buf[linelen + 1] = '\0';

    fputs(buf, keylog_file_fp);
    if(buf != stackbuf)
      free(buf);
  }
}